

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O0

void initLCA(int root,int n)

{
  int local_18;
  int local_14;
  int i;
  int l;
  int n_local;
  int root_local;
  
  pred[root][0] = -1;
  d[root] = 0;
  dfs(root);
  for (local_14 = 1; local_14 < 0x14; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
      if (pred[local_18][local_14 + -1] == -1) {
        pred[local_18][local_14] = -1;
      }
      else {
        pred[local_18][local_14] = pred[pred[local_18][local_14 + -1]][local_14 + -1];
      }
    }
  }
  return;
}

Assistant:

void initLCA(int root, int n = N) {
    pred[root][0] = -1, d[root] = 0;
    dfs(root);
    rep(l, 1, LOG) rep(i, 0, n) {
        if (pred[i][l - 1] == -1) pred[i][l] = -1;
        else pred[i][l] = pred[pred[i][l - 1]][l - 1];
    }
}